

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O3

void plugin_loader_destroy(plugin_loader_conflict l)

{
  if (l != (plugin_loader_conflict)0x0) {
    if (l->library_suffix != (char *)0x0) {
      free(l->library_suffix);
    }
    if (l->symbol_iface_suffix != (char *)0x0) {
      free(l->symbol_iface_suffix);
    }
    free(l);
    return;
  }
  return;
}

Assistant:

void plugin_loader_destroy(plugin_loader l)
{
	if (l != NULL)
	{
		if (l->library_suffix != NULL)
		{
			free(l->library_suffix);
		}

		if (l->symbol_iface_suffix != NULL)
		{
			free(l->symbol_iface_suffix);
		}

		free(l);
	}
}